

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tribench.c
# Opt level: O1

void paint(ATimeUs timestamp,float dt)

{
  undefined4 *puVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  AMat4f model4;
  AGLClearParams clear;
  AMat4f vp4;
  undefined8 local_178;
  float afStack_170 [8];
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined1 local_138 [16];
  AVec4f local_128;
  AVec4f local_118;
  AVec4f local_108;
  AVec4f local_f8;
  undefined8 local_e0;
  undefined4 local_d8;
  undefined1 local_d0 [16];
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  undefined8 local_a0;
  undefined8 uStack_98;
  AGLClearParams local_90;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  fVar9 = (float)timestamp * 1e-06;
  local_90.a = 1.0;
  local_90.r = sinf(fVar9 * 0.1);
  local_90.r = local_90.r * 0.0;
  local_90.g = sinf(fVar9 * 0.2);
  local_90.g = local_90.g * 0.0;
  local_90.b = sinf(fVar9 * 0.3);
  local_90.b = local_90.b * 0.0;
  local_90.depth = 1.0;
  local_90.bits = AGLCB_ColorAndDepth;
  aGLClear(&local_90,&g.target);
  g.pun[2].value.pf = (GLfloat *)&local_e0;
  local_e0 = 0x3f800000;
  local_d8 = 0;
  fVar6 = sinf(fVar9 * 0.37);
  fVar6 = fVar6 * 0.7;
  fVar7 = fVar6 * fVar6 + 0.040000003 + 0.48999998;
  if (fVar7 < 0.0) {
    fVar7 = sqrtf(fVar7);
  }
  else {
    fVar7 = SQRT(fVar7);
  }
  fVar7 = 1.0 / fVar7;
  local_138 = ZEXT416((uint)(fVar7 * 0.7));
  fVar9 = fVar9 * -0.4 * 0.5;
  fVar8 = cosf(fVar9);
  fVar9 = sinf(fVar9);
  fVar14 = fVar6 * fVar7 * fVar9;
  fVar7 = fVar7 * 0.2 * fVar9;
  fVar9 = (float)local_138._0_4_ * fVar9;
  fVar6 = fVar7 * fVar7 + fVar9 * fVar9;
  local_d0._0_4_ = 1.0 - (fVar6 + fVar6);
  fVar6 = fVar14 * fVar7 + fVar8 * fVar9;
  local_d0._4_4_ = fVar6 + fVar6;
  fVar11 = fVar14 * fVar9 - fVar8 * fVar7;
  fVar6 = fVar14 * fVar7 - fVar8 * fVar9;
  fVar12 = fVar9 * fVar9 + fVar14 * fVar14;
  fVar13 = fVar9 * fVar7 + fVar8 * fVar14;
  fVar10 = fVar8 * fVar7 + fVar14 * fVar9;
  fVar9 = fVar9 * fVar7 - fVar8 * fVar14;
  fVar7 = fVar14 * fVar14 + fVar7 * fVar7;
  local_d0._8_4_ = fVar11 + fVar11;
  local_d0._12_4_ = 0;
  local_c0._4_4_ = 1.0 - (fVar12 + fVar12);
  local_c0._0_4_ = fVar6 + fVar6;
  local_c0._8_4_ = fVar13 + fVar13;
  local_c0._12_4_ = 0;
  local_b0._4_4_ = fVar9 + fVar9;
  local_b0._0_4_ = fVar10 + fVar10;
  local_b0._8_4_ = 1.0 - (fVar7 + fVar7);
  local_b0._12_4_ = 0;
  local_a0 = 0;
  uStack_98 = 0x3f80000000000000;
  afStack_170[4] = 0.0;
  afStack_170[5] = 0.0;
  afStack_170[6] = 0.0;
  afStack_170[7] = 0.0;
  local_178 = SUB168(ZEXT416(0x3f800000),0);
  afStack_170[0] = 0.0;
  afStack_170[1] = 0.0;
  afStack_170[2] = 0.0;
  afStack_170[3] = 1.0;
  local_150 = SUB168(ZEXT416(0x3f800000),0);
  uStack_148 = 0;
  local_140 = 0x3f800000c1200000;
  local_128 = g.projection.X;
  local_118 = g.projection.Y;
  local_108 = g.projection.Z;
  local_f8 = g.projection.W;
  puVar1 = &aMat4fMul_m;
  lVar2 = 0;
  do {
    fVar6 = (&local_128.x)[lVar2];
    fVar7 = (&local_118.x)[lVar2];
    fVar9 = (&local_108.x)[lVar2];
    fVar8 = (&local_f8.x)[lVar2];
    lVar3 = 0;
    do {
      *(float *)((long)puVar1 + lVar3) =
           *(float *)((long)afStack_170 + lVar3 + 4) * fVar8 +
           *(float *)((long)afStack_170 + lVar3) * fVar9 +
           *(float *)((long)&local_178 + lVar3) * fVar6 +
           *(float *)((long)&local_178 + lVar3 + 4) * fVar7;
      lVar3 = lVar3 + 0x10;
    } while (lVar3 != 0x40);
    lVar2 = lVar2 + 1;
    puVar1 = puVar1 + 1;
  } while (lVar2 != 4);
  g.pun[0].value.pf = (GLfloat *)&local_78;
  local_48 = _DAT_0010ac78;
  uStack_40 = uRam000000000010ac80;
  local_58 = _DAT_0010ac68;
  uStack_50 = uRam000000000010ac70;
  local_68 = _DAT_0010ac58;
  uStack_60 = uRam000000000010ac60;
  local_78 = _aMat4fMul_m;
  uStack_70 = uRam000000000010ac50;
  g.pun[1].value.pf = (GLfloat *)local_d0;
  if (0x5fff < g.vertices_count) {
    iVar5 = 0;
    uVar4 = 0;
    do {
      g.draw.primitive.count = 0x6000;
      g.draw.primitive.first = iVar5;
      aGLDraw(&g.draw,&g.merge,&g.target);
      uVar4 = uVar4 + 1;
      iVar5 = iVar5 + 0x6000;
    } while (uVar4 < g.vertices_count / 0x6000);
  }
  g.pun[1].value.pf = (GLfloat *)0x0;
  g.pun[0].value.pf = (GLfloat *)0x0;
  return;
}

Assistant:

static void paint(ATimeUs timestamp, float dt) {
	float t = timestamp * 1e-6f;
	AGLClearParams clear;
	(void)(dt);

	clear.a = 1;
	clear.r = .0f * sinf(t * .1f);
	clear.g = .0f * sinf(t * .2f);
	clear.b = .0f * sinf(t * .3f);
	clear.depth = 1;
	clear.bits = AGLCB_Everything;

	aGLClear(&clear, &g.target);

	struct AVec3f lpos = aVec3f(1, 0, 0);
	g.pun[VUniLightDir].value.pf = &lpos.x;

	struct AReFrame frame;
	frame.orient = aQuatRotation(aVec3fNormalize(aVec3f(.7f * sinf(t * .37f), .2f, .7f)), -t * .4f);
	// frame.orient = aQuatRotation(aVec3fNormalize(aVec3f(1, 1, .6)), t*.1f);
	frame.transl = aVec3f(0, 0, 0);

	struct AMat4f model4 = aMat4fReFrame(frame), vp4 = aMat4fMul(g.projection, aMat4fTranslation(aVec3f(0, 0, -10)));
	g.pun[VUniModel].value.pf = &model4.X.x;
	g.pun[VUniVP].value.pf = &vp4.X.x;

	const unsigned int split = 8192 * 3;
	for (unsigned int i = 0; i < g.vertices_count / split; ++i) {
		g.draw.primitive.first = split * i;
		g.draw.primitive.count = split;
		aGLDraw(&g.draw, &g.merge, &g.target);
	}

	g.pun[VUniModel].value.pf = NULL;
	g.pun[VUniVP].value.pf = NULL;
}